

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_io.c
# Opt level: O2

int s3gaudnom_write(char *fn,float32 ***dnom,uint32 n_cb,uint32 n_feat,uint32 n_density)

{
  int iVar1;
  int32 iVar2;
  FILE *fp;
  int iVar3;
  uint32 chksum;
  uint32 ignore;
  char *local_38;
  
  chksum = 0;
  ignore = 0;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  local_38 = fn;
  fp = s3open(fn,"wb",(uint32 *)0x0);
  iVar3 = -1;
  if (fp != (FILE *)0x0) {
    iVar1 = bio_fwrite_3d(dnom,4,n_cb,n_feat,n_density,fp,&chksum);
    if (iVar1 < 0) {
      s3close(fp);
    }
    else {
      iVar2 = bio_fwrite(&chksum,4,1,fp,0,&ignore);
      s3close(fp);
      if (iVar2 == 1) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                ,0x255,"Wrote %s [%ux%ux%u array]\n",local_38,(ulong)n_cb,(ulong)n_feat,n_density);
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int
s3gaudnom_write(const char *fn,
		float32 ***dnom,
		uint32 n_cb,
		uint32 n_feat,
		uint32 n_density)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;

    s3clr_fattr();
    s3add_fattr("version", GAUDNOM_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    if (bio_fwrite_3d((void ***)dnom,
		   sizeof(float32),
		   n_cb,
		   n_feat,
		   n_density,
		   fp,
		   &chksum) < 0) {
	s3close(fp);
	return S3_ERROR;
    }
	
    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);

	return S3_ERROR;
    }
	
    s3close(fp);

    E_INFO("Wrote %s [%ux%ux%u array]\n",
	   fn, n_cb, n_feat, n_density);

    return S3_SUCCESS;
}